

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-knowledge.c
# Opt level: O0

void display_group_member
               (menu_conflict *menu,wchar_t oid,_Bool cursor,wchar_t row,wchar_t col,wchar_t wid)

{
  uint8_t attr_00;
  undefined8 *puVar1;
  char *pcVar2;
  byte *pbVar3;
  size_t sVar4;
  char local_45 [8];
  char buf [12];
  uint8_t a;
  wchar_t c;
  uint8_t attr;
  member_funcs *o_funcs;
  wchar_t wid_local;
  wchar_t col_local;
  wchar_t row_local;
  _Bool cursor_local;
  wchar_t oid_local;
  menu_conflict *menu_local;
  
  puVar1 = (undefined8 *)menu->menu_data;
  attr_00 = curs_attrs[1][(int)(uint)((uint)cursor == oid)];
  (*(code *)*puVar1)(col,row,cursor,oid);
  if (((*(byte *)(puVar1 + 6) & 1) != 0) && (puVar1[3] != 0)) {
    pcVar2 = (char *)(*(code *)puVar1[2])(oid);
    buf._5_4_ = *(undefined4 *)pcVar2;
    pbVar3 = (byte *)(*(code *)puVar1[3])(oid);
    buf[4] = *pbVar3;
    strnfmt(local_45,0xc,"%d/%d",(ulong)(byte)buf[4],(ulong)(uint)buf._5_4_);
    sVar4 = strlen(local_45);
    c_put_str(attr_00,local_45,row,L'@' - (int)sVar4);
  }
  return;
}

Assistant:

static void display_group_member(struct menu *menu, int oid,
						bool cursor, int row, int col, int wid)
{
	const member_funcs *o_funcs = menu->menu_data;
	uint8_t attr = curs_attrs[CURS_KNOWN][cursor == oid];

	(void)wid;

	/* Print the interesting part */
	o_funcs->display_member(col, row, cursor, oid);

#ifdef KNOWLEDGE_MENU_DEBUG
	c_put_str(attr, format("%d", oid), row, 60);
#endif

	/* Do visual mode */
	if (o_funcs->is_visual && o_funcs->xattr) {
		wchar_t c = *o_funcs->xchar(oid);
		uint8_t a = *o_funcs->xattr(oid);
		char buf[12];

		strnfmt(buf, sizeof(buf), "%d/%d", a, c);
		c_put_str(attr, buf, row, 64 - (int) strlen(buf));
	}
}